

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_tet_dvol_dnode0(REF_NODE ref_node,REF_INT *nodes,REF_DBL *vol,REF_DBL *d_vol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  REF_GLOB *pRVar9;
  REF_DBL *pRVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  iVar4 = *nodes;
  if (((-1 < (long)iVar4) && (iVar5 = ref_node->max, iVar4 < iVar5)) &&
     (pRVar9 = ref_node->global, -1 < pRVar9[iVar4])) {
    uVar6 = nodes[1];
    if (((int)uVar6 < iVar5 && -1 < (int)uVar6) && (-1 < pRVar9[uVar6])) {
      uVar7 = nodes[2];
      if (((int)uVar7 < iVar5 && -1 < (int)uVar7) && (-1 < pRVar9[uVar7])) {
        uVar8 = nodes[3];
        if (((int)uVar8 < iVar5 && -1 < (int)uVar8) && (-1 < pRVar9[uVar8])) {
          pRVar10 = ref_node->real;
          uVar14 = (ulong)(uint)(iVar4 * 0xf);
          uVar11 = (ulong)(uVar6 * 0xf);
          uVar12 = (ulong)(uVar7 * 0xf);
          uVar13 = (ulong)(uVar8 * 0xf);
          dVar1 = pRVar10[uVar13];
          dVar2 = pRVar10[uVar13 + 1];
          dVar3 = pRVar10[uVar13 + 2];
          *vol = (((pRVar10[uVar11] - dVar1) * (pRVar10[uVar12 + 1] - dVar2) -
                  (pRVar10[uVar12] - dVar1) * (pRVar10[uVar11 + 1] - dVar2)) *
                  (pRVar10[uVar14 + 2] - dVar3) +
                 (((pRVar10[uVar11 + 1] - dVar2) * (pRVar10[uVar12 + 2] - dVar3) -
                  (pRVar10[uVar11 + 2] - dVar3) * (pRVar10[uVar12 + 1] - dVar2)) *
                  (pRVar10[uVar14] - dVar1) -
                 ((pRVar10[uVar12 + 2] - dVar3) * (pRVar10[uVar11] - dVar1) -
                 (pRVar10[uVar11 + 2] - dVar3) * (pRVar10[uVar12] - dVar1)) *
                 (pRVar10[uVar14 + 1] - dVar2))) / -6.0;
          *d_vol = ((pRVar10[uVar12 + 2] - pRVar10[uVar13 + 2]) *
                    (pRVar10[uVar11 + 1] - pRVar10[uVar13 + 1]) -
                   (pRVar10[uVar11 + 2] - pRVar10[uVar13 + 2]) *
                   (pRVar10[uVar12 + 1] - pRVar10[uVar13 + 1])) / -6.0;
          d_vol[1] = ((pRVar10[uVar12 + 2] - pRVar10[uVar13 + 2]) *
                      (pRVar10[uVar11] - pRVar10[uVar13]) -
                     (pRVar10[uVar11 + 2] - pRVar10[uVar13 + 2]) *
                     (pRVar10[uVar12] - pRVar10[uVar13])) / 6.0;
          d_vol[2] = ((pRVar10[uVar12 + 1] - pRVar10[uVar13 + 1]) *
                      (pRVar10[uVar11] - pRVar10[uVar13]) -
                     (pRVar10[uVar11 + 1] - pRVar10[uVar13 + 1]) *
                     (pRVar10[uVar12] - pRVar10[uVar13])) / -6.0;
          return 0;
        }
      }
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x9f6,
         "ref_node_tet_dvol_dnode0",3,"node invalid");
  return 3;
}

Assistant:

REF_FCN REF_STATUS ref_node_tet_dvol_dnode0(REF_NODE ref_node, REF_INT *nodes,
                                            REF_DBL *vol, REF_DBL *d_vol) {
  REF_DBL *a, *b, *c, *d;
  REF_DBL m11, m12, m13;
  REF_DBL det;

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]) ||
      !ref_node_valid(ref_node, nodes[3]))
    RSS(REF_INVALID, "node invalid");

  a = ref_node_xyz_ptr(ref_node, nodes[0]);
  b = ref_node_xyz_ptr(ref_node, nodes[1]);
  c = ref_node_xyz_ptr(ref_node, nodes[2]);
  d = ref_node_xyz_ptr(ref_node, nodes[3]);

  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  det = (m11 - m12 + m13);

  *vol = -det / 6.0;
  d_vol[0] =
      -((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2])) / 6.0;
  d_vol[1] =
      ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2])) / 6.0;
  d_vol[2] =
      -((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1])) / 6.0;

  return REF_SUCCESS;
}